

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O1

MPP_RET mpp_trie_deinit(MppTrie trie)

{
  MPP_RET MVar1;
  
  if (trie == (MppTrie)0x0) {
    _mpp_log_l(2,"mpp_trie","invalid NULL input trie\n","mpp_trie_deinit");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (*(int *)((long)trie + 0x28) != 0) {
      if (*(void **)((long)trie + 0x30) != (void *)0x0) {
        mpp_osal_free("mpp_trie_deinit",*(void **)((long)trie + 0x30));
      }
      *(undefined8 *)((long)trie + 0x30) = 0;
    }
    if (*(void **)((long)trie + 0x20) != (void *)0x0) {
      mpp_osal_free("mpp_trie_deinit",*(void **)((long)trie + 0x20));
    }
    *(undefined8 *)((long)trie + 0x20) = 0;
    if (*(void **)((long)trie + 0x38) != (void *)0x0) {
      mpp_osal_free("mpp_trie_deinit",*(void **)((long)trie + 0x38));
    }
    *(undefined8 *)((long)trie + 0x38) = 0;
    if (*(void **)((long)trie + 0x40) != (void *)0x0) {
      mpp_osal_free("mpp_trie_deinit",*(void **)((long)trie + 0x40));
    }
    *(undefined8 *)((long)trie + 0x40) = 0;
    mpp_osal_free("mpp_trie_deinit",trie);
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_trie_deinit(MppTrie trie)
{
    if (!trie) {
        mpp_err_f("invalid NULL input trie\n");
        return MPP_ERR_NULL_PTR;
    }

    MppTrieImpl *p = (MppTrieImpl *)trie;

    if (p->node_count)
        MPP_FREE(p->nodes);

    MPP_FREE(p->info);
    MPP_FREE(p->info_buf);
    MPP_FREE(p->name_buf);
    MPP_FREE(p);

    return MPP_OK;
}